

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QTextObject * __thiscall
QMap<int,_QTextObject_*>::value(QMap<int,_QTextObject_*> *this,int *key,QTextObject **defaultValue)

{
  bool bVar1;
  pointer ppVar2;
  undefined8 *in_RDX;
  long in_FS_OFFSET;
  const_iterator i;
  map<int,_QTextObject_*,_std::less<int>,_std::allocator<std::pair<const_int,_QTextObject_*>_>_>
  *in_stack_ffffffffffffffb8;
  QTextObject *local_20;
  _Self local_18;
  _Self local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTextObject_*,_std::less<int>,_std::allocator<std::pair<const_int,_QTextObject_*>_>_>_>_>
                      *)0x7d9104);
  if (bVar1) {
    local_10._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTextObject_*,_std::less<int>,_std::allocator<std::pair<const_int,_QTextObject_*>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTextObject_*,_std::less<int>,_std::allocator<std::pair<const_int,_QTextObject_*>_>_>_>_>
                  *)0x7d912d);
    local_10._M_node =
         (_Base_ptr)
         std::
         map<int,_QTextObject_*,_std::less<int>,_std::allocator<std::pair<const_int,_QTextObject_*>_>_>
         ::find(in_stack_ffffffffffffffb8,(key_type *)0x7d913e);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTextObject_*,_std::less<int>,_std::allocator<std::pair<const_int,_QTextObject_*>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTextObject_*,_std::less<int>,_std::allocator<std::pair<const_int,_QTextObject_*>_>_>_>_>
                  *)0x7d914d);
    local_18._M_node =
         (_Base_ptr)
         std::
         map<int,_QTextObject_*,_std::less<int>,_std::allocator<std::pair<const_int,_QTextObject_*>_>_>
         ::cend(in_stack_ffffffffffffffb8);
    bVar1 = std::operator!=(&local_10,&local_18);
    if (bVar1) {
      ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_QTextObject_*>_>::operator->
                         ((_Rb_tree_const_iterator<std::pair<const_int,_QTextObject_*>_> *)0x7d917d)
      ;
      local_20 = ppVar2->second;
    }
    else {
      local_20 = (QTextObject *)*in_RDX;
    }
  }
  else {
    local_20 = (QTextObject *)*in_RDX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }